

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_edit_buffer(nk_context *ctx,nk_flags flags,nk_text_edit *edit,nk_plugin_filter filter)

{
  char cVar1;
  int iVar2;
  long lVar3;
  nk_widget_layout_states nVar4;
  undefined8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  nk_hash hash;
  uchar prev_state;
  nk_flags ret_flags;
  nk_rect bounds;
  nk_widget_layout_states state;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_style_edit *in_stack_00000240;
  nk_text_edit *in_stack_00000248;
  nk_plugin_filter in_stack_00000250;
  nk_flags in_stack_0000025c;
  nk_command_buffer *in_stack_00000260;
  nk_flags *in_stack_00000268;
  nk_rect in_stack_00000274;
  nk_input *in_stack_00000290;
  nk_user_font *in_stack_00000298;
  nk_context *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  nk_flags local_4;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    lVar3 = *(long *)(in_RDI + 0x40d8);
    nVar4 = nk_widget((nk_rect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0);
    if (nVar4 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      iVar2 = *(int *)(lVar3 + 0x184);
      *(int *)(lVar3 + 0x184) = iVar2 + 1;
      if ((*(int *)(lVar3 + 0x18c) == 0) || (iVar2 != *(int *)(lVar3 + 0x180))) {
        *(undefined1 *)((long)in_RDX + 0xb9) = 0;
      }
      else {
        if ((in_ESI & 0x10) != 0) {
          *(undefined4 *)(in_RDX + 0x15) = *(undefined4 *)(in_RDX + 0x12);
        }
        if ((in_ESI & 0x20) == 0) {
          *(undefined4 *)((long)in_RDX + 0xac) = *(undefined4 *)(in_RDX + 0x15);
          *(undefined4 *)(in_RDX + 0x16) = *(undefined4 *)(in_RDX + 0x15);
        }
        if ((in_ESI & 0x40) != 0) {
          *in_RDX = *(undefined8 *)(in_RDI + 0x1f58);
          in_RDX[1] = *(undefined8 *)(in_RDI + 0x1f60);
          in_RDX[2] = *(undefined8 *)(in_RDI + 0x1f68);
        }
        *(char *)((long)in_RDX + 0xb9) = (char)*(undefined4 *)(lVar3 + 0x18c);
      }
      *(undefined1 *)((long)in_RDX + 0xb4) = *(undefined1 *)(lVar3 + 0x1a8);
      cVar1 = *(char *)((long)in_RDX + 0xb9);
      local_4 = nk_do_edit(in_stack_00000268,in_stack_00000260,in_stack_00000274,in_stack_0000025c,
                           in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000290,
                           in_stack_00000298);
      if ((*(uint *)(in_RDI + 0x1f70) & 0x10) != 0) {
        *(undefined8 *)(in_RDI + 0x1a8) = *(undefined8 *)(in_RDI + 0x178);
      }
      if ((*(char *)((long)in_RDX + 0xb9) == '\0') || (cVar1 == *(char *)((long)in_RDX + 0xb9))) {
        if ((cVar1 != '\0') && (*(char *)((long)in_RDX + 0xb9) == '\0')) {
          *(undefined4 *)(lVar3 + 0x18c) = 0;
        }
      }
      else {
        *(undefined4 *)(lVar3 + 0x18c) = 1;
        *(int *)(lVar3 + 0x180) = iVar2;
      }
    }
  }
  return local_4;
}

Assistant:

NK_API nk_flags
nk_edit_buffer(struct nk_context *ctx, nk_flags flags,
struct nk_text_edit *edit, nk_plugin_filter filter)
{
struct nk_window *win;
struct nk_style *style;
struct nk_input *in;

enum nk_widget_layout_states state;
struct nk_rect bounds;

nk_flags ret_flags = 0;
unsigned char prev_state;
nk_hash hash;

/* make sure correct values */
NK_ASSERT(ctx);
NK_ASSERT(edit);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
state = nk_widget(&bounds, ctx);
if (!state) return state;
in = (win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

/* check if edit is currently hot item */
hash = win->edit.seq++;
if (win->edit.active && hash == win->edit.name) {
if (flags & NK_EDIT_NO_CURSOR)
edit->cursor = edit->string.len;
if (!(flags & NK_EDIT_SELECTABLE)) {
edit->select_start = edit->cursor;
edit->select_end = edit->cursor;
}
if (flags & NK_EDIT_CLIPBOARD)
edit->clip = ctx->clip;
edit->active = (unsigned char)win->edit.active;
} else edit->active = nk_false;
edit->mode = win->edit.mode;

filter = (!filter) ? nk_filter_default: filter;
prev_state = (unsigned char)edit->active;
in = (flags & NK_EDIT_READ_ONLY) ? 0: in;
ret_flags = nk_do_edit(&ctx->last_widget_state, &win->buffer, bounds, flags,
filter, edit, &style->edit, in, style->font);

if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_TEXT];
if (edit->active && prev_state != edit->active) {
/* current edit is now hot */
win->edit.active = nk_true;
win->edit.name = hash;
} else if (prev_state && !edit->active) {
/* current edit is now cold */
win->edit.active = nk_false;
} return ret_flags;
}